

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cc
# Opt level: O1

Binary_data * __thiscall
iqxmlrpc::Value::get_binary(Binary_data *__return_storage_ptr__,Value *this)

{
  pointer pcVar1;
  Binary_data *pBVar2;
  
  pBVar2 = cast<iqxmlrpc::Binary_data>(this);
  (__return_storage_ptr__->super_Value_type)._vptr_Value_type =
       (_func_int **)&PTR__Binary_data_0018c038;
  (__return_storage_ptr__->data)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->data).field_2
  ;
  pcVar1 = (pBVar2->data)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->data,pcVar1,pcVar1 + (pBVar2->data)._M_string_length
            );
  (__return_storage_ptr__->base64)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->base64).field_2;
  pcVar1 = (pBVar2->base64)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->base64,pcVar1,
             pcVar1 + (pBVar2->base64)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

Binary_data Value::get_binary() const
{
  return Binary_data(*cast<Binary_data>());
}